

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O3

bool __thiscall CGameControllerCTF::CanBeMovedOnBalance(CGameControllerCTF *this,int ClientID)

{
  bool bVar1;
  bool bVar2;
  CCharacter *pCVar3;
  long lVar4;
  bool bVar5;
  
  pCVar3 = CPlayer::GetCharacter
                     (((this->super_IGameController).m_pGameServer)->m_apPlayers[ClientID]);
  if (pCVar3 == (CCharacter *)0x0) {
LAB_00120e10:
    bVar5 = true;
  }
  else {
    lVar4 = 0;
    bVar2 = true;
    do {
      while (this->m_apFlags[lVar4] == (CFlag *)0x0) {
        lVar4 = 1;
        bVar1 = !bVar2;
        bVar2 = false;
        if (bVar1) goto LAB_00120e10;
      }
      bVar5 = this->m_apFlags[lVar4]->m_pCarrier != pCVar3;
      lVar4 = 1;
      bVar1 = (bool)(bVar5 & bVar2);
      bVar2 = false;
    } while (bVar1);
  }
  return bVar5;
}

Assistant:

bool CGameControllerCTF::CanBeMovedOnBalance(int ClientID) const
{
	CCharacter* Character = GameServer()->m_apPlayers[ClientID]->GetCharacter();
	if(Character)
	{
		for(int fi = 0; fi < 2; fi++)
		{
			CFlag *F = m_apFlags[fi];
			if(F && F->GetCarrier() == Character)
				return false;
		}
	}
	return true;
}